

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_units_string(int uu)

{
  char *pcStack_10;
  int uu_local;
  
  switch(uu) {
  case 1:
    pcStack_10 = "m";
    break;
  case 2:
    pcStack_10 = "mm";
    break;
  case 3:
    pcStack_10 = "um";
    break;
  default:
    pcStack_10 = "Unknown";
    break;
  case 8:
    pcStack_10 = "s";
    break;
  case 0x10:
    pcStack_10 = "ms";
    break;
  case 0x18:
    pcStack_10 = "us";
    break;
  case 0x20:
    pcStack_10 = "Hz";
    break;
  case 0x28:
    pcStack_10 = "ppm";
    break;
  case 0x30:
    pcStack_10 = "rad/s";
  }
  return pcStack_10;
}

Assistant:

char const *nifti_units_string( int uu )
{
   switch( uu ){
     case NIFTI_UNITS_METER:  return "m" ;
     case NIFTI_UNITS_MM:     return "mm" ;
     case NIFTI_UNITS_MICRON: return "um" ;
     case NIFTI_UNITS_SEC:    return "s" ;
     case NIFTI_UNITS_MSEC:   return "ms" ;
     case NIFTI_UNITS_USEC:   return "us" ;
     case NIFTI_UNITS_HZ:     return "Hz" ;
     case NIFTI_UNITS_PPM:    return "ppm" ;
     case NIFTI_UNITS_RADS:   return "rad/s" ;
   }
   return "Unknown" ;
}